

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  uint uVar1;
  int number;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  string *psVar5;
  undefined8 *puVar6;
  ArenaStringPtr *pAVar7;
  Arena *arena;
  string local_50;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar3 = FieldDescriptor::cpp_type(field);
  if (CVar3 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar1 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    TVar4 = FieldDescriptor::type(field);
    std::__cxx11::string::string((string *)&local_50,(string *)value);
    internal::ExtensionSet::SetString
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar1),number,
               (FieldType)TVar4,&local_50,field);
    std::__cxx11::string::~string((string *)&local_50);
    return;
  }
  bVar2 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
  if (bVar2) {
    psVar5 = (string *)
             MutableField<google::protobuf::internal::InlinedStringField>(this,message,field);
  }
  else {
    puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    psVar5 = (string *)*puVar6;
    if (*(long *)(field + 0x58) != 0) {
      bVar2 = HasOneofField(this,message,field);
      if (!bVar2) {
        ClearOneof(this,message,*(OneofDescriptor **)(field + 0x58));
        pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
        pAVar7->ptr_ = psVar5;
      }
    }
    pAVar7 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
    arena = *(Arena **)
             ((long)&(message->super_MessageLite)._vptr_MessageLite +
             (ulong)(uint)(this->schema_).metadata_offset_);
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
    }
    psVar5 = internal::ArenaStringPtr::Mutable(pAVar7,psVar5,arena);
  }
  std::__cxx11::string::operator=((string *)psVar5,(string *)value);
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), std::move(value), field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          MutableField<InlinedStringField>(message, field)
              ->SetNoArena(nullptr, std::move(value));
          break;
        }

        const std::string* default_ptr =
            &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)
              ->UnsafeSetDefault(default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Mutable(default_ptr, GetArena(message))->assign(std::move(value));
        break;
      }
    }
  }
}